

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeFrhs1(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *ufb,
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lfb)

{
  uint *puVar1;
  Status SVar2;
  pointer pnVar3;
  undefined8 uVar4;
  type_conflict5 tVar5;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar6;
  ostream *poVar7;
  SPxInternalCodeException *this_00;
  long lVar8;
  long lVar9;
  allocator local_b1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  
  lVar8 = 0xc;
  lVar9 = 0;
  local_b0 = lfb;
  do {
    if ((this->thevectors->set).thenum <= lVar9) {
      return;
    }
    SVar2 = ((this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.stat)->data[lVar9];
    if (this->theRep * SVar2 < 1) {
      local_a8.m_backend.fpclass = cpp_dec_float_finite;
      local_a8.m_backend.prec_elem = 10;
      local_a8.m_backend.data._M_elems[0] = 0;
      local_a8.m_backend.data._M_elems[1] = 0;
      local_a8.m_backend.data._M_elems[2] = 0;
      local_a8.m_backend.data._M_elems[3] = 0;
      local_a8.m_backend.data._M_elems[4] = 0;
      local_a8.m_backend.data._M_elems[5] = 0;
      local_a8.m_backend.data._M_elems._24_5_ = 0;
      local_a8.m_backend.data._M_elems[7]._1_3_ = 0;
      local_a8.m_backend.data._M_elems._32_5_ = 0;
      local_a8.m_backend.data._M_elems[9]._1_3_ = 0;
      local_a8.m_backend.exp = 0;
      local_a8.m_backend.neg = false;
      pVVar6 = ufb;
      switch(SVar2) {
      case P_FIXED:
      case P_ON_LOWER:
      case D_ON_LOWER:
      case D_ON_BOTH:
        pVVar6 = local_b0;
      case P_ON_UPPER:
      case D_ON_UPPER:
        pnVar3 = (pVVar6->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar4 = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar8 * 4 + -0x10);
        local_a8.m_backend.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_a8.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar8 * 4 + -0x30);
        local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar8 * 4 + -0x20);
        local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_a8.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_a8.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_a8.m_backend.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar8 * 4 + -8);
        local_a8.m_backend.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar8 * 4 + -4);
        local_a8.m_backend._48_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar8 * 4);
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        tVar5 = boost::multiprecision::operator!=(&local_a8,(double *)&result);
        if (tVar5) {
          result.m_backend.data._M_elems[7]._1_3_ = local_a8.m_backend.data._M_elems[7]._1_3_;
          result.m_backend.data._M_elems._24_5_ = local_a8.m_backend.data._M_elems._24_5_;
          result.m_backend.data._M_elems[0] = local_a8.m_backend.data._M_elems[0];
          result.m_backend.data._M_elems[1] = local_a8.m_backend.data._M_elems[1];
          uVar4 = result.m_backend.data._M_elems._0_8_;
          result.m_backend.data._M_elems[2] = local_a8.m_backend.data._M_elems[2];
          result.m_backend.data._M_elems[3] = local_a8.m_backend.data._M_elems[3];
          result.m_backend.data._M_elems[9]._1_3_ = local_a8.m_backend.data._M_elems[9]._1_3_;
          result.m_backend.data._M_elems._32_5_ = local_a8.m_backend.data._M_elems._32_5_;
          result.m_backend.data._M_elems[4] = local_a8.m_backend.data._M_elems[4];
          result.m_backend.data._M_elems[5] = local_a8.m_backend.data._M_elems[5];
          result.m_backend.exp = local_a8.m_backend.exp;
          result.m_backend.neg = local_a8.m_backend.neg;
          result.m_backend.fpclass = local_a8.m_backend.fpclass;
          result.m_backend.prec_elem = local_a8.m_backend.prec_elem;
          result.m_backend.data._M_elems[0] = local_a8.m_backend.data._M_elems[0];
          if (local_a8.m_backend.fpclass != cpp_dec_float_finite ||
              result.m_backend.data._M_elems[0] != 0) {
            result.m_backend.neg = (bool)(local_a8.m_backend.neg ^ 1);
          }
          result.m_backend.data._M_elems._0_8_ = uVar4;
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          ::
          multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      *)this->theFrhs,&result,
                     (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)((this->thevectors->set).theitem + (this->thevectors->set).thekey[lVar9].idx
                        ));
        }
        break;
      default:
        poVar7 = std::operator<<((ostream *)&std::cerr,"ESVECS03 ERROR: ");
        poVar7 = std::operator<<(poVar7,"inconsistent basis must not happen!");
        std::endl<char,std::char_traits<char>>(poVar7);
        this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&result,"XSVECS04 This should never happen.",&local_b1);
        SPxInternalCodeException::SPxInternalCodeException(this_00,(string *)&result);
        __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      case P_FREE:
      case D_FREE:
      case D_UNDEFINED:
        break;
      }
    }
    lVar9 = lVar9 + 1;
    lVar8 = lVar8 + 0xe;
  } while( true );
}

Assistant:

void SPxSolverBase<R>::computeFrhs1(
   const VectorBase<R>& ufb,    ///< upper feasibility bound for variables
   const VectorBase<R>& lfb)    ///< lower feasibility bound for variables
{

   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   for(int i = 0; i < coDim(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(i);

      if(!isBasic(stat))
      {
         R x;

         // coverity[switch_selector_expr_is_constant]
         switch(stat)
         {
         case SPxBasisBase<R>::Desc::D_FREE :
         case SPxBasisBase<R>::Desc::D_UNDEFINED :
         case SPxBasisBase<R>::Desc::P_FREE :
            continue;

         case SPxBasisBase<R>::Desc::P_ON_UPPER :
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            x = ufb[i];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            x = lfb[i];
            break;

         case(SPxBasisBase<R>::Desc::P_FIXED) :
            assert(EQ(lfb[i], ufb[i], this->epsilon()));

         //lint -fallthrough
         case(SPxBasisBase<R>::Desc::D_ON_BOTH) :
            x = lfb[i];
            break;

         default:
            SPX_MSG_ERROR(std::cerr << "ESVECS03 ERROR: "
                          << "inconsistent basis must not happen!"
                          << std::endl;)
            throw SPxInternalCodeException("XSVECS04 This should never happen.");
         }

         assert(x < R(infinity));
         assert(x > R(-infinity));

         if(x != 0.0)
            theFrhs->multAdd(-x, vector(i));
      }
   }
}